

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost89.c
# Opt level: O2

void cryptopro_key_meshing(gost_ctx *ctx,uchar *iv)

{
  uchar newiv [8];
  uchar newkey [32];
  
  gost_dec(ctx,"i",newkey,4);
  gost_key(ctx,newkey);
  OPENSSL_cleanse(newkey,0x20);
  if (iv != (uchar *)0x0) {
    gostcrypt(ctx,iv,newiv);
    *(uchar (*) [8])iv = newiv;
    OPENSSL_cleanse(newiv,8);
  }
  return;
}

Assistant:

void cryptopro_key_meshing(gost_ctx * ctx, unsigned char *iv)
{
    unsigned char newkey[32];
    /* Set static keymeshing key */
    /* "Decrypt" key with keymeshing key */
    gost_dec(ctx, CryptoProKeyMeshingKey, newkey, 4);
    /* set new key */
    gost_key(ctx, newkey);
    OPENSSL_cleanse(newkey, sizeof(newkey));
    /* Encrypt iv with new key */
    if (iv != NULL ) {
        unsigned char newiv[8];
        gostcrypt(ctx, iv, newiv);
        memcpy(iv, newiv, 8);
        OPENSSL_cleanse(newiv, sizeof(newiv));
    }
}